

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O0

LabelInstr * __thiscall
FlowGraph::DeleteLeaveChainBlocks(FlowGraph *this,BranchInstr *leaveInstr,Instr **instrPrev)

{
  code *pcVar1;
  bool bVar2;
  LabelInstr *pLVar3;
  Instr *pIVar4;
  undefined4 *puVar5;
  Instr *pIVar6;
  BasicBlock *pBVar7;
  BasicBlock *curBlock;
  LabelInstr *exitLabel;
  BasicBlock *curBlock_1;
  Instr *loopEnd;
  Instr *nextLabel;
  LabelInstr *curLabel;
  BranchInstr *leaveChain;
  LabelInstr *leaveTarget;
  Instr **instrPrev_local;
  BranchInstr *leaveInstr_local;
  FlowGraph *this_local;
  
  pLVar3 = IR::BranchInstr::GetTarget(leaveInstr);
  pIVar4 = IR::Instr::GetNextBranchOrLabel(&pLVar3->super_Instr);
  bVar2 = IR::Instr::IsBranchInstr(pIVar4);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x19,"(leaveTarget->GetNextBranchOrLabel()->IsBranchInstr())",
                       "leaveTarget->GetNextBranchOrLabel()->IsBranchInstr()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pIVar4 = IR::Instr::GetNextBranchOrLabel(&pLVar3->super_Instr);
  curLabel = (LabelInstr *)IR::Instr::AsBranchInstr(pIVar4);
  nextLabel = &IR::Instr::AsLabelInstr(&pLVar3->super_Instr)->super_Instr;
  do {
    if ((curLabel->super_Instr).m_opcode == Br) {
      *instrPrev = (curLabel->super_Instr).m_next;
      pLVar3 = IR::BranchInstr::GetTarget((BranchInstr *)curLabel);
      pBVar7 = IR::LabelInstr::GetBasicBlock((LabelInstr *)nextLabel);
      RemoveBlock(this,pBVar7,(GlobOpt *)0x0,false);
      return pLVar3;
    }
    if (((curLabel->super_Instr).m_opcode != Leave) &&
       ((curLabel->super_Instr).m_opcode != BrOnException)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x1f,
                         "(leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException)"
                         ,
                         "leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException"
                        );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    pIVar4 = IR::Instr::GetNextRealInstrOrLabel(&curLabel->super_Instr);
    pIVar6 = IR::Instr::GetNextRealInstrOrLabel(pIVar4);
    bVar2 = IR::Instr::IsBranchInstr(pIVar6);
    if (bVar2) {
      pIVar6 = IR::Instr::GetNextRealInstrOrLabel(pIVar4);
      curLabel = (LabelInstr *)IR::Instr::AsBranchInstr(pIVar6);
    }
    else {
      pIVar6 = IR::Instr::GetNextRealInstrOrLabel(pIVar4);
      if (pIVar6->m_opcode != ProfiledLoopEnd) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                           ,0x24,
                           "(nextLabel->GetNextRealInstrOrLabel()->m_opcode == Js::OpCode::ProfiledLoopEnd)"
                           ,
                           "nextLabel->GetNextRealInstrOrLabel()->m_opcode == Js::OpCode::ProfiledLoopEnd"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      curBlock_1 = (BasicBlock *)IR::Instr::GetNextRealInstrOrLabel(pIVar4);
      while( true ) {
        pIVar6 = IR::Instr::GetNextRealInstrOrLabel((Instr *)curBlock_1);
        bVar2 = IR::Instr::IsBranchInstr(pIVar6);
        if (((bVar2 ^ 0xffU) & 1) == 0) break;
        if (*(short *)&curBlock_1->upwardExposedFields != 0xef) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x28,"(loopEnd->m_opcode == Js::OpCode::ProfiledLoopEnd)",
                             "loopEnd->m_opcode == Js::OpCode::ProfiledLoopEnd");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        curBlock_1 = (BasicBlock *)IR::Instr::GetNextRealInstrOrLabel((Instr *)curBlock_1);
      }
      pIVar6 = IR::Instr::GetNextRealInstrOrLabel((Instr *)curBlock_1);
      curLabel = (LabelInstr *)IR::Instr::AsBranchInstr(pIVar6);
    }
    pBVar7 = IR::LabelInstr::GetBasicBlock((LabelInstr *)nextLabel);
    RemoveBlock(this,pBVar7,(GlobOpt *)0x0,false);
    nextLabel = &IR::Instr::AsLabelInstr(pIVar4)->super_Instr;
  } while( true );
}

Assistant:

IR::LabelInstr * FlowGraph::DeleteLeaveChainBlocks(IR::BranchInstr *leaveInstr, IR::Instr * &instrPrev)
{
    // Cleanup Rest of the Leave chain
    IR::LabelInstr * leaveTarget = leaveInstr->GetTarget();
    Assert(leaveTarget->GetNextBranchOrLabel()->IsBranchInstr());
    IR::BranchInstr *leaveChain = leaveTarget->GetNextBranchOrLabel()->AsBranchInstr();
    IR::LabelInstr * curLabel = leaveTarget->AsLabelInstr();

    while (leaveChain->m_opcode != Js::OpCode::Br)
    {
        Assert(leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException);
        IR::Instr * nextLabel = leaveChain->GetNextRealInstrOrLabel();
        if (!nextLabel->GetNextRealInstrOrLabel()->IsBranchInstr())
        {
            // For jit loop bodies - we can encounter ProfiledLoopEnd before every early return
            Assert(nextLabel->GetNextRealInstrOrLabel()->m_opcode == Js::OpCode::ProfiledLoopEnd);
            IR::Instr * loopEnd = nextLabel->GetNextRealInstrOrLabel();
            while (!loopEnd->GetNextRealInstrOrLabel()->IsBranchInstr())
            {
                Assert(loopEnd->m_opcode == Js::OpCode::ProfiledLoopEnd);
                loopEnd = loopEnd->GetNextRealInstrOrLabel();
            }
            leaveChain = loopEnd->GetNextRealInstrOrLabel()->AsBranchInstr();
        }
        else
        {
            leaveChain = nextLabel->GetNextRealInstrOrLabel()->AsBranchInstr();
        }
        BasicBlock *curBlock = curLabel->GetBasicBlock();
        this->RemoveBlock(curBlock);
        curLabel = nextLabel->AsLabelInstr();
    }

    instrPrev = leaveChain->m_next;
    IR::LabelInstr * exitLabel = leaveChain->GetTarget();
    BasicBlock * curBlock = curLabel->GetBasicBlock();
    this->RemoveBlock(curBlock);
    return exitLabel;
}